

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CovergroupBodySymbol::CovergroupBodySymbol
          (CovergroupBodySymbol *this,Compilation *comp,SourceLocation loc)

{
  Scope *this_00;
  LanguageVersion LVar1;
  Type *fieldType;
  Type *fieldType_00;
  Type *fieldType_01;
  Type *fieldType_02;
  StructBuilder *in_R9;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  StructBuilder type_option;
  StructBuilder option;
  
  (this->super_Symbol).kind = CovergroupBody;
  (this->super_Symbol).name._M_len = 0;
  (this->super_Symbol).name._M_str = "";
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  this_00 = &this->super_Scope;
  Scope::Scope(this_00,comp,&this->super_Symbol);
  (this->options)._M_ptr = (pointer)0x0;
  (this->options)._M_extent._M_extent_value = 0;
  this->lastBuiltinMember = (Symbol *)0x0;
  fieldType = comp->intType;
  fieldType_00 = comp->bitType;
  fieldType_01 = comp->stringType;
  fieldType_02 = comp->realType;
  LVar1 = (comp->options).languageVersion;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)0x0;
  lookupLocation.index = 0;
  StructBuilder::StructBuilder(&option,this_00,lookupLocation);
  name_00._M_str = "name";
  name_00._M_len = 4;
  StructBuilder::addField(&option,name_00,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0);
  name_01._M_str = "weight";
  name_01._M_len = 6;
  StructBuilder::addField(&option,name_01,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  name_02._M_str = "goal";
  name_02._M_len = 4;
  StructBuilder::addField(&option,name_02,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  name_03._M_str = "comment";
  name_03._M_len = 7;
  StructBuilder::addField(&option,name_03,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0);
  name_04._M_str = "at_least";
  name_04._M_len = 8;
  StructBuilder::addField(&option,name_04,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  name_05._M_str = "auto_bin_max";
  name_05._M_len = 0xc;
  StructBuilder::addField(&option,name_05,fieldType,(bitmask<slang::ast::VariableFlags>)0x4);
  name_06._M_str = "cross_num_print_missing";
  name_06._M_len = 0x17;
  StructBuilder::addField(&option,name_06,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  if (0 < (int)LVar1) {
    name_07._M_str = "cross_retain_auto_bins";
    name_07._M_len = 0x16;
    StructBuilder::addField(&option,name_07,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x4);
  }
  name_08._M_str = "detect_overlap";
  name_08._M_len = 0xe;
  StructBuilder::addField(&option,name_08,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x4);
  name_09._M_str = "per_instance";
  name_09._M_len = 0xc;
  StructBuilder::addField(&option,name_09,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x4);
  name_10._M_str = "get_inst_coverage";
  name_10._M_len = 0x11;
  StructBuilder::addField(&option,name_10,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x4);
  addProperty((ast *)this_00,(Scope *)0x6,(string_view)ZEXT816(0x472505),(VariableLifetime)&option,
              in_R9);
  lookupLocation_00._12_4_ = 0;
  lookupLocation_00.scope = (Scope *)0x0;
  lookupLocation_00.index = 0;
  StructBuilder::StructBuilder(&type_option,this_00,lookupLocation_00);
  name_11._M_str = "weight";
  name_11._M_len = 6;
  StructBuilder::addField(&type_option,name_11,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  name_12._M_str = "goal";
  name_12._M_len = 4;
  StructBuilder::addField(&type_option,name_12,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  name_13._M_str = "comment";
  name_13._M_len = 7;
  StructBuilder::addField(&type_option,name_13,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_14._M_str = "strobe";
  name_14._M_len = 6;
  StructBuilder::addField(&type_option,name_14,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x4)
  ;
  name_15._M_str = "merge_instances";
  name_15._M_len = 0xf;
  StructBuilder::addField(&type_option,name_15,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_16._M_str = "distribute_first";
  name_16._M_len = 0x10;
  StructBuilder::addField(&type_option,name_16,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  if (0 < (int)LVar1) {
    name_17._M_str = "real_interval";
    name_17._M_len = 0xd;
    StructBuilder::addField
              (&type_option,name_17,fieldType_02,(bitmask<slang::ast::VariableFlags>)0x4);
  }
  name._M_str = (char *)0x1;
  name._M_len = (size_t)"type_option";
  addProperty((ast *)this_00,(Scope *)0xb,name,(VariableLifetime)&type_option,in_R9);
  addBuiltInMethods(this_00,true);
  this->lastBuiltinMember = (this->super_Scope).lastMember;
  return;
}

Assistant:

CovergroupBodySymbol::CovergroupBodySymbol(Compilation& comp, SourceLocation loc) :
    Symbol(SymbolKind::CovergroupBody, ""sv, loc), Scope(comp, this) {

    auto& int_t = comp.getIntType();
    auto& bit_t = comp.getBitType();
    auto& string_t = comp.getStringType();
    auto& real_t = comp.getRealType();
    auto lv = comp.languageVersion();

    StructBuilder option(*this, LookupLocation::min);
    option.addField("name"sv, string_t);
    option.addField("weight"sv, int_t);
    option.addField("goal"sv, int_t);
    option.addField("comment"sv, string_t);
    option.addField("at_least"sv, int_t);
    option.addField("auto_bin_max"sv, int_t, VariableFlags::ImmutableCoverageOption);
    option.addField("cross_num_print_missing"sv, int_t);
    if (lv >= LanguageVersion::v1800_2023)
        option.addField("cross_retain_auto_bins"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    option.addField("detect_overlap"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    option.addField("per_instance"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    option.addField("get_inst_coverage"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "option"sv, VariableLifetime::Automatic, option);

    StructBuilder type_option(*this, LookupLocation::min);
    type_option.addField("weight"sv, int_t);
    type_option.addField("goal"sv, int_t);
    type_option.addField("comment"sv, string_t);
    type_option.addField("strobe"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    type_option.addField("merge_instances"sv, bit_t);
    type_option.addField("distribute_first"sv, bit_t);
    if (lv >= LanguageVersion::v1800_2023)
        type_option.addField("real_interval"sv, real_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "type_option"sv, VariableLifetime::Static, type_option);

    addBuiltInMethods(*this, true);

    lastBuiltinMember = getLastMember();
}